

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * dlib::trim<char,std::char_traits<char>,std::allocator<char>>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *trim_chars)

{
  long lVar1;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type rpos;
  size_type lpos;
  
  lVar1 = std::__cxx11::string::find_first_not_of(in_RSI,in_RDX);
  if (lVar1 == -1) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::__cxx11::string::find_last_not_of(in_RSI,in_RDX);
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

const std::basic_string<charT,traits,alloc> trim (
        const std::basic_string<charT,traits,alloc>& str,
        const std::basic_string<charT,traits,alloc>& trim_chars 
    )
    {
        typedef std::basic_string<charT,traits,alloc> string;
        typename string::size_type lpos = str.find_first_not_of(trim_chars); 
        if (lpos != string::npos)
        {
            typename string::size_type rpos = str.find_last_not_of(trim_chars);
            return str.substr(lpos,rpos-lpos+1);
        }
        else
        {
            return std::basic_string<charT,traits,alloc>();
        }
    }